

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_copy_hierarchy(Tree *this,size_t dst_,size_t src_)

{
  NodeData *pNVar1;
  NodeData *pNVar2;
  NodeData *pNVar3;
  NodeData *pNVar4;
  size_t sVar5;
  
  pNVar1 = _p(this,src_);
  pNVar2 = _p(this,dst_);
  pNVar3 = _p(this,pNVar1->m_parent);
  for (sVar5 = pNVar1->m_first_child; sVar5 != 0xffffffffffffffff; sVar5 = next_sibling(this,sVar5))
  {
    pNVar4 = _p(this,sVar5);
    pNVar4->m_parent = dst_;
  }
  if (pNVar1->m_prev_sibling != 0xffffffffffffffff) {
    pNVar4 = _p(this,pNVar1->m_prev_sibling);
    pNVar4->m_next_sibling = dst_;
  }
  if (pNVar1->m_next_sibling != 0xffffffffffffffff) {
    pNVar4 = _p(this,pNVar1->m_next_sibling);
    pNVar4->m_prev_sibling = dst_;
  }
  if (pNVar3->m_first_child == src_) {
    pNVar3->m_first_child = dst_;
  }
  if (pNVar3->m_last_child == src_) {
    pNVar3->m_last_child = dst_;
  }
  sVar5 = pNVar1->m_first_child;
  pNVar2->m_parent = pNVar1->m_parent;
  pNVar2->m_first_child = sVar5;
  pNVar2->m_prev_sibling = pNVar1->m_prev_sibling;
  sVar5 = pNVar1->m_next_sibling;
  pNVar2->m_last_child = pNVar1->m_last_child;
  pNVar2->m_next_sibling = sVar5;
  return;
}

Assistant:

void Tree::_copy_hierarchy(size_t dst_, size_t src_)
{
    auto const& C4_RESTRICT src = *_p(src_);
    auto      & C4_RESTRICT dst = *_p(dst_);
    auto      & C4_RESTRICT prt = *_p(src.m_parent);
    for(size_t i = src.m_first_child; i != NONE; i = next_sibling(i))
    {
        _p(i)->m_parent = dst_;
    }
    if(src.m_prev_sibling != NONE)
    {
        _p(src.m_prev_sibling)->m_next_sibling = dst_;
    }
    if(src.m_next_sibling != NONE)
    {
        _p(src.m_next_sibling)->m_prev_sibling = dst_;
    }
    if(prt.m_first_child == src_)
    {
        prt.m_first_child = dst_;
    }
    if(prt.m_last_child  == src_)
    {
        prt.m_last_child  = dst_;
    }
    dst.m_parent       = src.m_parent;
    dst.m_first_child  = src.m_first_child;
    dst.m_last_child   = src.m_last_child;
    dst.m_prev_sibling = src.m_prev_sibling;
    dst.m_next_sibling = src.m_next_sibling;
}